

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void impute_missing_values_internal<float,long,long_double>
               (float *numeric_data,int *categ_data,bool is_col_major,float *Xr,long *Xr_ind,
               long *Xr_indptr,size_t nrows,int nthreads,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar1;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *pvVar2;
  undefined1 auVar3 [16];
  ImputedData<long,_long_double> *__cur;
  ulong uVar4;
  size_t sVar5;
  void *__s;
  undefined8 uVar6;
  ulong uVar7;
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar8;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *pvVar9;
  size_t row;
  size_t sVar10;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree_00;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *__range4;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
  imp_memory;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  double local_f0;
  vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_> local_e8;
  undefined8 local_d0 [2];
  ulong local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  undefined1 local_90 [48];
  undefined1 local_60 [16];
  long *local_50;
  float *local_48;
  long *local_40;
  long *local_38;
  long lVar13;
  
  local_90._16_8_ = nrows;
  local_90._32_8_ = imputer->ncols_numeric;
  local_90._40_8_ = imputer->ncols_categ;
  local_60 = (undefined1  [16])0x0;
  local_50 = (long *)0x0;
  local_90._0_8_ = numeric_data;
  local_90._8_8_ = categ_data;
  local_90[0x18] = is_col_major;
  local_48 = Xr;
  local_40 = Xr_ind;
  local_38 = Xr_indptr;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,nrows,(allocator_type *)&local_e8);
  auVar3 = _DAT_0036b1f0;
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish +
            (-8 - (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    auVar14._8_4_ = (int)uVar4;
    auVar14._0_8_ = uVar4;
    auVar14._12_4_ = (int)(uVar4 >> 0x20);
    auVar11._0_8_ = uVar4 >> 3;
    auVar11._8_8_ = auVar14._8_8_ >> 3;
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_0036b1f0;
    auVar12 = _DAT_0036b1e0;
    do {
      auVar14 = auVar12 ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = uVar7;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 + 1] = uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
    } while (((uVar4 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
  }
  sVar5 = check_for_missing<PredictionData<float,long>>
                    ((PredictionData<float,_long> *)local_90,imputer,
                     local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,nthreads);
  if (sVar5 != 0) {
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __s = operator_new(0xf0);
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)__s;
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)__s;
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)__s + 0xf0);
    memset(__s,0,0xd8);
    local_e8.
    super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__s + 0xf0);
    if (model_outputs == (IsoForest *)0x0) {
      sVar10 = 0;
      uVar4 = 0;
      do {
        if ((uVar4 & 1) == 0) {
          initialize_impute_calc<ImputedData<long,long_double>,PredictionData<float,long>>
                    (local_e8.
                     super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (PredictionData<float,_long> *)local_90,imputer,
                     local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar10]);
          pvVar2 = (model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          hplane = (model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar9 = hplane;
          local_c0 = uVar4;
          for (; hplane != pvVar2; hplane = hplane + 1) {
            traverse_hplane<PredictionData<float,long>,long,ImputedData<long,long_double>>
                      (hplane,model_outputs_ext,(PredictionData<float,_long> *)local_90,&local_f0,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
                       (((long)(imputer->imputer_tree).
                               super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                        (long)(model_outputs_ext->hplanes).
                              super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) + (long)pvVar9),
                       local_e8.
                       super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(long *)0x0,(double *)0x0,
                       local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar10]);
            pvVar9 = pvVar9 + 1;
          }
          apply_imputation_results<PredictionData<float,long>,ImputedData<long,long_double>>
                    ((PredictionData<float,_long> *)local_90,
                     local_e8.
                     super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,imputer,
                     local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar10]);
          uVar4 = local_c0;
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != sVar5);
    }
    else {
      sVar10 = 0;
      uVar4 = 0;
      do {
        if ((uVar4 & 1) == 0) {
          initialize_impute_calc<ImputedData<long,long_double>,PredictionData<float,long>>
                    (local_e8.
                     super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (PredictionData<float,_long> *)local_90,imputer,
                     local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar10]);
          pvVar1 = (model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          tree_00 = (model_outputs->trees).
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = tree_00;
          local_c0 = uVar4;
          for (; tree_00 != pvVar1; tree_00 = tree_00 + 1) {
            traverse_itree<PredictionData<float,long>,long,ImputedData<long,long_double>>
                      (tree_00,model_outputs,(PredictionData<float,_long> *)local_90,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
                       (((long)(imputer->imputer_tree).
                               super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                        (long)(model_outputs->trees).
                              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) + (long)pvVar8),
                       local_e8.
                       super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,1.0,
                       local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar10],(long *)0x0,(double *)0x0,0)
            ;
            pvVar8 = pvVar8 + 1;
          }
          apply_imputation_results<PredictionData<float,long>,ImputedData<long,long_double>>
                    ((PredictionData<float,_long> *)local_90,
                     local_e8.
                     super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,imputer,
                     local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar10]);
          uVar4 = local_c0;
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != sVar5);
    }
    if ((uVar4 & 1) != 0) {
      local_d0[0] = 0;
      uVar6 = std::rethrow_exception((exception_ptr)local_d0);
      std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
      ::~vector(&local_e8);
      if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (size_t *)0x0) {
        operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar6);
    }
    std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
    ~vector(&local_e8);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (size_t *)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void impute_missing_values_internal(
                           real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, imputer.ncols_numeric, imputer.ncols_categ,
                                      NULL, NULL, NULL,
                                      Xr, Xr_ind, Xr_indptr};

    std::vector<size_t> ix_arr(nrows);
    std::iota(ix_arr.begin(), ix_arr.end(), (size_t) 0);

    size_t end = check_for_missing(prediction_data, imputer, ix_arr.data(), nthreads);

    if (end == 0)
        return;

    if ((size_t)nthreads > end)
        nthreads = (int)end;
    #ifdef _OPENMP
        std::vector<ImputedData<sparse_ix, ldouble_safe>> imp_memory(nthreads);
    #else
        std::vector<ImputedData<sparse_ix, ldouble_safe>> imp_memory(1);
    #endif

    bool threw_exception = false;
    std::exception_ptr ex = NULL;

    if (model_outputs != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(end, imp_memory, prediction_data, model_outputs, ix_arr, imputer, ex, threw_exception)
        for (size_t_for row = 0; row < (decltype(row))end; row++)
        {
            if (threw_exception) continue;
            try
            {
                initialize_impute_calc(imp_memory[omp_get_thread_num()], prediction_data, imputer, ix_arr[row]);

                for (std::vector<IsoTree> &tree : model_outputs->trees)
                {
                    traverse_itree(tree,
                                   *model_outputs,
                                   prediction_data,
                                   &imputer.imputer_tree[&tree - &(model_outputs->trees[0])],
                                   &imp_memory[omp_get_thread_num()],
                                   (double) 1,
                                   ix_arr[row],
                                   (sparse_ix*)NULL,
                                   (double*)NULL,
                                   (size_t) 0);
                }

                apply_imputation_results(prediction_data, imp_memory[omp_get_thread_num()], imputer, (size_t) ix_arr[row]);
            }

            catch(...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }

        }
    }

    else
    {
        double temp;
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(end, imp_memory, prediction_data, model_outputs_ext, ix_arr, imputer, ex, threw_exception) \
                private(temp)
        for (size_t_for row = 0; row < (decltype(row))end; row++)
        {
            if (threw_exception) continue;
            try
            {
                initialize_impute_calc(imp_memory[omp_get_thread_num()], prediction_data, imputer, ix_arr[row]);

                for (std::vector<IsoHPlane> &hplane : model_outputs_ext->hplanes)
                {
                    traverse_hplane(hplane,
                                    *model_outputs_ext,
                                    prediction_data,
                                    temp,
                                    &imputer.imputer_tree[&hplane - &(model_outputs_ext->hplanes[0])],
                                    &imp_memory[omp_get_thread_num()],
                                    (sparse_ix*)NULL,
                                    (double*)NULL,
                                    ix_arr[row]);
                }

                apply_imputation_results(prediction_data, imp_memory[omp_get_thread_num()], imputer, (size_t) ix_arr[row]);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }

        }
    }

    if (threw_exception)
        std::rethrow_exception(ex);
}